

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_init(cubeb_conflict1 **context,char *context_name)

{
  uint uVar1;
  char *pcm_name;
  snd_config_t *psVar2;
  undefined8 *in_RDI;
  snd_pcm_t *dummy;
  pthread_attr_t attr;
  int fd [2];
  int i;
  int r;
  cubeb_conflict1 *ctx;
  void *libasound;
  snd_config_t *in_stack_ffffffffffffff78;
  snd_pcm_stream_t in_stack_ffffffffffffff80;
  snd_pcm_stream_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  snd_pcm_stream_t local_38 [4];
  long local_20;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                  ,0x33c,"int alsa_init(cubeb **, const char *)");
  }
  *in_RDI = 0;
  local_20 = dlopen("libasound.so.2",1);
  if ((local_20 == 0) && (local_20 = dlopen("libasound.so",1), local_20 == 0)) {
    local_4 = -1;
  }
  else {
    cubeb_snd_config = (snd_config_t **)dlsym(local_20,"snd_config");
    if (cubeb_snd_config == (snd_config_t **)0x0) {
      dlclose(local_20);
      local_4 = -1;
    }
    else {
      cubeb_snd_config_add =
           (_func_int_snd_config_t_ptr_snd_config_t_ptr *)dlsym(local_20,"snd_config_add");
      if (cubeb_snd_config_add == (_func_int_snd_config_t_ptr_snd_config_t_ptr *)0x0) {
        dlclose(local_20);
        local_4 = -1;
      }
      else {
        cubeb_snd_config_copy =
             (_func_int_snd_config_t_ptr_ptr_snd_config_t_ptr *)dlsym(local_20,"snd_config_copy");
        if (cubeb_snd_config_copy == (_func_int_snd_config_t_ptr_ptr_snd_config_t_ptr *)0x0) {
          dlclose(local_20);
          local_4 = -1;
        }
        else {
          cubeb_snd_config_delete =
               (_func_int_snd_config_t_ptr *)dlsym(local_20,"snd_config_delete");
          if (cubeb_snd_config_delete == (_func_int_snd_config_t_ptr *)0x0) {
            dlclose(local_20);
            local_4 = -1;
          }
          else {
            cubeb_snd_config_get_id =
                 (_func_int_snd_config_t_ptr_char_ptr_ptr *)dlsym(local_20,"snd_config_get_id");
            if (cubeb_snd_config_get_id == (_func_int_snd_config_t_ptr_char_ptr_ptr *)0x0) {
              dlclose(local_20);
              local_4 = -1;
            }
            else {
              cubeb_snd_config_get_string =
                   (_func_int_snd_config_t_ptr_char_ptr_ptr *)
                   dlsym(local_20,"snd_config_get_string");
              if (cubeb_snd_config_get_string == (_func_int_snd_config_t_ptr_char_ptr_ptr *)0x0) {
                dlclose(local_20);
                local_4 = -1;
              }
              else {
                cubeb_snd_config_imake_integer =
                     (_func_int_snd_config_t_ptr_ptr_char_ptr_long *)
                     dlsym(local_20,"snd_config_imake_integer");
                if (cubeb_snd_config_imake_integer ==
                    (_func_int_snd_config_t_ptr_ptr_char_ptr_long *)0x0) {
                  dlclose(local_20);
                  local_4 = -1;
                }
                else {
                  cubeb_snd_config_search =
                       (_func_int_snd_config_t_ptr_char_ptr_snd_config_t_ptr_ptr *)
                       dlsym(local_20,"snd_config_search");
                  if (cubeb_snd_config_search ==
                      (_func_int_snd_config_t_ptr_char_ptr_snd_config_t_ptr_ptr *)0x0) {
                    dlclose(local_20);
                    local_4 = -1;
                  }
                  else {
                    cubeb_snd_config_search_definition =
                         (_func_int_snd_config_t_ptr_char_ptr_char_ptr_snd_config_t_ptr_ptr *)
                         dlsym(local_20,"snd_config_search_definition");
                    if (cubeb_snd_config_search_definition ==
                        (_func_int_snd_config_t_ptr_char_ptr_char_ptr_snd_config_t_ptr_ptr *)0x0) {
                      dlclose(local_20);
                      local_4 = -1;
                    }
                    else {
                      cubeb_snd_lib_error_set_handler =
                           (_func_int_snd_lib_error_handler_t *)
                           dlsym(local_20,"snd_lib_error_set_handler");
                      if (cubeb_snd_lib_error_set_handler ==
                          (_func_int_snd_lib_error_handler_t *)0x0) {
                        dlclose(local_20);
                        local_4 = -1;
                      }
                      else {
                        cubeb_snd_pcm_avail_update =
                             (_func_snd_pcm_sframes_t_snd_pcm_t_ptr *)
                             dlsym(local_20,"snd_pcm_avail_update");
                        if (cubeb_snd_pcm_avail_update ==
                            (_func_snd_pcm_sframes_t_snd_pcm_t_ptr *)0x0) {
                          dlclose(local_20);
                          local_4 = -1;
                        }
                        else {
                          cubeb_snd_pcm_close =
                               (_func_int_snd_pcm_t_ptr *)dlsym(local_20,"snd_pcm_close");
                          if (cubeb_snd_pcm_close == (_func_int_snd_pcm_t_ptr *)0x0) {
                            dlclose(local_20);
                            local_4 = -1;
                          }
                          else {
                            cubeb_snd_pcm_delay =
                                 (_func_int_snd_pcm_t_ptr_snd_pcm_sframes_t_ptr *)
                                 dlsym(local_20,"snd_pcm_delay");
                            if (cubeb_snd_pcm_delay ==
                                (_func_int_snd_pcm_t_ptr_snd_pcm_sframes_t_ptr *)0x0) {
                              dlclose(local_20);
                              local_4 = -1;
                            }
                            else {
                              cubeb_snd_pcm_drain =
                                   (_func_int_snd_pcm_t_ptr *)dlsym(local_20,"snd_pcm_drain");
                              if (cubeb_snd_pcm_drain == (_func_int_snd_pcm_t_ptr *)0x0) {
                                dlclose(local_20);
                                local_4 = -1;
                              }
                              else {
                                cubeb_snd_pcm_frames_to_bytes =
                                     (_func_ssize_t_snd_pcm_t_ptr_snd_pcm_sframes_t *)
                                     dlsym(local_20,"snd_pcm_frames_to_bytes");
                                if (cubeb_snd_pcm_frames_to_bytes ==
                                    (_func_ssize_t_snd_pcm_t_ptr_snd_pcm_sframes_t *)0x0) {
                                  dlclose(local_20);
                                  local_4 = -1;
                                }
                                else {
                                  cubeb_snd_pcm_get_params =
                                       (_func_int_snd_pcm_t_ptr_snd_pcm_uframes_t_ptr_snd_pcm_uframes_t_ptr
                                        *)dlsym(local_20,"snd_pcm_get_params");
                                  if (cubeb_snd_pcm_get_params ==
                                      (_func_int_snd_pcm_t_ptr_snd_pcm_uframes_t_ptr_snd_pcm_uframes_t_ptr
                                       *)0x0) {
                                    dlclose(local_20);
                                    local_4 = -1;
                                  }
                                  else {
                                    cubeb_snd_pcm_hw_params_any =
                                         (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr *)
                                         dlsym(local_20,"snd_pcm_hw_params_any");
                                    if (cubeb_snd_pcm_hw_params_any ==
                                        (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr *)0x0) {
                                      dlclose(local_20);
                                      local_4 = -1;
                                    }
                                    else {
                                      cubeb_snd_pcm_hw_params_get_channels_max =
                                           (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr *)
                                           dlsym(local_20,"snd_pcm_hw_params_get_channels_max");
                                      if (cubeb_snd_pcm_hw_params_get_channels_max ==
                                          (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr *)0x0) {
                                        dlclose(local_20);
                                        local_4 = -1;
                                      }
                                      else {
                                        cubeb_snd_pcm_hw_params_get_rate =
                                             (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr *)
                                             dlsym(local_20,"snd_pcm_hw_params_get_rate");
                                        if (cubeb_snd_pcm_hw_params_get_rate ==
                                            (_func_int_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr *)
                                            0x0) {
                                          dlclose(local_20);
                                          local_4 = -1;
                                        }
                                        else {
                                          cubeb_snd_pcm_hw_params_set_rate_near =
                                               (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr
                                                *)dlsym(local_20,"snd_pcm_hw_params_set_rate_near");
                                          if (cubeb_snd_pcm_hw_params_set_rate_near ==
                                              (_func_int_snd_pcm_t_ptr_snd_pcm_hw_params_t_ptr_uint_ptr_int_ptr
                                               *)0x0) {
                                            dlclose(local_20);
                                            local_4 = -1;
                                          }
                                          else {
                                            cubeb_snd_pcm_hw_params_sizeof =
                                                 (_func_size_t *)
                                                 dlsym(local_20,"snd_pcm_hw_params_sizeof");
                                            if (cubeb_snd_pcm_hw_params_sizeof ==
                                                (_func_size_t *)0x0) {
                                              dlclose(local_20);
                                              local_4 = -1;
                                            }
                                            else {
                                              cubeb_snd_pcm_nonblock =
                                                   (_func_int_snd_pcm_t_ptr_int *)
                                                   dlsym(local_20,"snd_pcm_nonblock");
                                              if (cubeb_snd_pcm_nonblock ==
                                                  (_func_int_snd_pcm_t_ptr_int *)0x0) {
                                                dlclose(local_20);
                                                local_4 = -1;
                                              }
                                              else {
                                                cubeb_snd_pcm_open =
                                                     (
                                                  _func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int
                                                  *)dlsym(local_20,"snd_pcm_open");
                                                if (cubeb_snd_pcm_open ==
                                                    (
                                                  _func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int
                                                  *)0x0) {
                                                  dlclose(local_20);
                                                  local_4 = -1;
                                                }
                                                else {
                                                  cubeb_snd_pcm_open_lconf =
                                                       (
                                                  _func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int_snd_config_t_ptr
                                                  *)dlsym(local_20,"snd_pcm_open_lconf");
                                                  if (cubeb_snd_pcm_open_lconf ==
                                                      (
                                                  _func_int_snd_pcm_t_ptr_ptr_char_ptr_snd_pcm_stream_t_int_snd_config_t_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_snd_pcm_pause =
                                                         (_func_int_snd_pcm_t_ptr_int *)
                                                         dlsym(local_20,"snd_pcm_pause");
                                                    if (cubeb_snd_pcm_pause ==
                                                        (_func_int_snd_pcm_t_ptr_int *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_snd_pcm_poll_descriptors =
                                                           (_func_int_snd_pcm_t_ptr_pollfd_ptr_uint
                                                            *)dlsym(local_20,
                                                  "snd_pcm_poll_descriptors");
                                                  if (cubeb_snd_pcm_poll_descriptors ==
                                                      (_func_int_snd_pcm_t_ptr_pollfd_ptr_uint *)0x0
                                                     ) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_snd_pcm_poll_descriptors_count =
                                                         (_func_int_snd_pcm_t_ptr *)
                                                         dlsym(local_20,
                                                  "snd_pcm_poll_descriptors_count");
                                                  if (cubeb_snd_pcm_poll_descriptors_count ==
                                                      (_func_int_snd_pcm_t_ptr *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_snd_pcm_poll_descriptors_revents =
                                                         (
                                                  _func_int_snd_pcm_t_ptr_pollfd_ptr_uint_unsigned_short_ptr
                                                  *)dlsym(local_20,
                                                  "snd_pcm_poll_descriptors_revents");
                                                  if (cubeb_snd_pcm_poll_descriptors_revents ==
                                                      (
                                                  _func_int_snd_pcm_t_ptr_pollfd_ptr_uint_unsigned_short_ptr
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_snd_pcm_readi =
                                                         (
                                                  _func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t
                                                  *)dlsym(local_20,"snd_pcm_readi");
                                                  if (cubeb_snd_pcm_readi ==
                                                      (
                                                  _func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_snd_pcm_recover =
                                                         (_func_int_snd_pcm_t_ptr_int_int *)
                                                         dlsym(local_20,"snd_pcm_recover");
                                                    if (cubeb_snd_pcm_recover ==
                                                        (_func_int_snd_pcm_t_ptr_int_int *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_snd_pcm_set_params =
                                                           (
                                                  _func_int_snd_pcm_t_ptr_snd_pcm_format_t_snd_pcm_access_t_uint_uint_int_uint
                                                  *)dlsym(local_20,"snd_pcm_set_params");
                                                  if (cubeb_snd_pcm_set_params ==
                                                      (
                                                  _func_int_snd_pcm_t_ptr_snd_pcm_format_t_snd_pcm_access_t_uint_uint_int_uint
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    cubeb_snd_pcm_start =
                                                         (_func_int_snd_pcm_t_ptr *)
                                                         dlsym(local_20,"snd_pcm_start");
                                                    if (cubeb_snd_pcm_start ==
                                                        (_func_int_snd_pcm_t_ptr *)0x0) {
                                                      dlclose(local_20);
                                                      local_4 = -1;
                                                    }
                                                    else {
                                                      cubeb_snd_pcm_state =
                                                           (_func_snd_pcm_state_t_snd_pcm_t_ptr *)
                                                           dlsym(local_20,"snd_pcm_state");
                                                      if (cubeb_snd_pcm_state ==
                                                          (_func_snd_pcm_state_t_snd_pcm_t_ptr *)0x0
                                                         ) {
                                                        dlclose(local_20);
                                                        local_4 = -1;
                                                      }
                                                      else {
                                                        cubeb_snd_pcm_writei =
                                                             (
                                                  _func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t
                                                  *)dlsym(local_20,"snd_pcm_writei");
                                                  if (cubeb_snd_pcm_writei ==
                                                      (
                                                  _func_snd_pcm_sframes_t_snd_pcm_t_ptr_void_ptr_snd_pcm_uframes_t
                                                  *)0x0) {
                                                    dlclose(local_20);
                                                    local_4 = -1;
                                                  }
                                                  else {
                                                    pthread_mutex_lock((pthread_mutex_t *)
                                                                       &cubeb_alsa_mutex);
                                                    if (cubeb_alsa_error_handler_set == 0) {
                                                      (*cubeb_snd_lib_error_set_handler)
                                                                (silent_error_handler);
                                                      cubeb_alsa_error_handler_set = 1;
                                                    }
                                                    pthread_mutex_unlock
                                                              ((pthread_mutex_t *)&cubeb_alsa_mutex)
                                                    ;
                                                    pcm_name = (char *)calloc(1,0xf8);
                                                    if (pcm_name == (char *)0x0) {
                                                      __assert_fail("ctx",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                                                  ,0x35d,"int alsa_init(cubeb **, const char *)");
                                                  }
                                                  *(cubeb_ops_conflict1 **)pcm_name = &alsa_ops;
                                                  *(long *)(pcm_name + 8) = local_20;
                                                  local_38[3] = pthread_mutex_init((pthread_mutex_t
                                                                                    *)(pcm_name +
                                                                                      0x18),(
                                                  pthread_mutexattr_t *)0x0);
                                                  if (local_38[3] != 0) {
                                                    __assert_fail("r == 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                                                  ,0x363,"int alsa_init(cubeb **, const char *)");
                                                  }
                                                  local_38[3] = pipe((int *)local_38);
                                                  if (local_38[3] != 0) {
                                                    __assert_fail("r == 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                                                  ,0x366,"int alsa_init(cubeb **, const char *)");
                                                  }
                                                  for (local_38[2] = 0; (int)local_38[2] < 2;
                                                      local_38[2] = local_38[2] + 1) {
                                                    in_stack_ffffffffffffff80 =
                                                         local_38[(int)local_38[2]];
                                                    uVar1 = fcntl(local_38[(int)local_38[2]],1);
                                                    fcntl(in_stack_ffffffffffffff80,2,
                                                          (ulong)(uVar1 | 1));
                                                    in_stack_ffffffffffffff84 =
                                                         local_38[(int)local_38[2]];
                                                    uVar1 = fcntl(local_38[(int)local_38[2]],3);
                                                    fcntl(in_stack_ffffffffffffff84,4,
                                                          (ulong)(uVar1 | 0x800));
                                                  }
                                                  *(snd_pcm_stream_t *)(pcm_name + 0xd8) =
                                                       local_38[0];
                                                  *(snd_pcm_stream_t *)(pcm_name + 0xdc) =
                                                       local_38[1];
                                                  pcm_name[0xd0] = '\x01';
                                                  pcm_name[0xd1] = '\0';
                                                  pcm_name[0xd2] = '\0';
                                                  pcm_name[0xd3] = '\0';
                                                  local_38[3] = pthread_attr_init((pthread_attr_t *)
                                                                                  &
                                                  stack0xffffffffffffff90);
                                                  if (local_38[3] != 0) {
                                                    __assert_fail("r == 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                                                  ,0x375,"int alsa_init(cubeb **, const char *)");
                                                  }
                                                  local_38[3] = pthread_attr_setstacksize
                                                                          ((pthread_attr_t *)
                                                                           &stack0xffffffffffffff90,
                                                                           0x40000);
                                                  if (local_38[3] != 0) {
                                                    __assert_fail("r == 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                                                  ,0x378,"int alsa_init(cubeb **, const char *)");
                                                  }
                                                  local_38[3] = pthread_create((pthread_t *)
                                                                               (pcm_name + 0x10),
                                                                               (pthread_attr_t *)
                                                                               &
                                                  stack0xffffffffffffff90,alsa_run_thread,pcm_name);
                                                  if (local_38[3] != 0) {
                                                    __assert_fail("r == 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                                                  ,0x37b,"int alsa_init(cubeb **, const char *)");
                                                  }
                                                  local_38[3] = pthread_attr_destroy
                                                                          ((pthread_attr_t *)
                                                                           &stack0xffffffffffffff90)
                                                  ;
                                                  if (local_38[3] != 0) {
                                                    __assert_fail("r == 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                                                  ,0x37e,"int alsa_init(cubeb **, const char *)");
                                                  }
                                                  local_38[3] = alsa_locked_pcm_open
                                                                          ((snd_pcm_t **)
                                                                           in_stack_ffffffffffffff90
                                                                           ,
                                                  in_stack_ffffffffffffff88,
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff78);
                                                  if (-1 < (int)local_38[3]) {
                                                    alsa_locked_pcm_close
                                                              ((snd_pcm_t *)
                                                               CONCAT44(in_stack_ffffffffffffff84,
                                                                        in_stack_ffffffffffffff80));
                                                  }
                                                  pcm_name[0xf0] = '\0';
                                                  pcm_name[0xf1] = '\0';
                                                  pcm_name[0xf2] = '\0';
                                                  pcm_name[0xf3] = '\0';
                                                  pthread_mutex_lock((pthread_mutex_t *)
                                                                     &cubeb_alsa_mutex);
                                                  psVar2 = init_local_config_with_workaround
                                                                     (pcm_name);
                                                  *(snd_config_t **)(pcm_name + 0xe8) = psVar2;
                                                  pthread_mutex_unlock
                                                            ((pthread_mutex_t *)&cubeb_alsa_mutex);
                                                  if (*(long *)(pcm_name + 0xe8) != 0) {
                                                    pcm_name[0xf0] = '\x01';
                                                    pcm_name[0xf1] = '\0';
                                                    pcm_name[0xf2] = '\0';
                                                    pcm_name[0xf3] = '\0';
                                                    local_38[3] = alsa_locked_pcm_open
                                                                            ((snd_pcm_t **)
                                                                                                                                                          
                                                  in_stack_ffffffffffffff90,
                                                  in_stack_ffffffffffffff88,
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff78);
                                                  if (local_38[3] == -0x16) {
                                                    pthread_mutex_lock((pthread_mutex_t *)
                                                                       &cubeb_alsa_mutex);
                                                    (*cubeb_snd_config_delete)
                                                              (*(snd_config_t **)(pcm_name + 0xe8));
                                                    pthread_mutex_unlock
                                                              ((pthread_mutex_t *)&cubeb_alsa_mutex)
                                                    ;
                                                    pcm_name[0xe8] = '\0';
                                                    pcm_name[0xe9] = '\0';
                                                    pcm_name[0xea] = '\0';
                                                    pcm_name[0xeb] = '\0';
                                                    pcm_name[0xec] = '\0';
                                                    pcm_name[0xed] = '\0';
                                                    pcm_name[0xee] = '\0';
                                                    pcm_name[0xef] = '\0';
                                                  }
                                                  else if (-1 < (int)local_38[3]) {
                                                    alsa_locked_pcm_close
                                                              ((snd_pcm_t *)
                                                               CONCAT44(in_stack_ffffffffffffff84,
                                                                        in_stack_ffffffffffffff80));
                                                  }
                                                  }
                                                  *in_RDI = pcm_name;
                                                  local_4 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int
alsa_init(cubeb ** context, char const * context_name)
{
  (void)context_name;
  void * libasound = NULL;
  cubeb * ctx;
  int r;
  int i;
  int fd[2];
  pthread_attr_t attr;
  snd_pcm_t * dummy;

  assert(context);
  *context = NULL;

#ifndef DISABLE_LIBASOUND_DLOPEN
  libasound = dlopen("libasound.so.2", RTLD_LAZY);
  if (!libasound) {
    libasound = dlopen("libasound.so", RTLD_LAZY);
    if (!libasound) {
      return CUBEB_ERROR;
    }
  }

#define LOAD(x)                                                                \
  {                                                                            \
    cubeb_##x = dlsym(libasound, #x);                                          \
    if (!cubeb_##x) {                                                          \
      dlclose(libasound);                                                      \
      return CUBEB_ERROR;                                                      \
    }                                                                          \
  }

  LIBASOUND_API_VISIT(LOAD);
#undef LOAD
#endif

  pthread_mutex_lock(&cubeb_alsa_mutex);
  if (!cubeb_alsa_error_handler_set) {
    WRAP(snd_lib_error_set_handler)(silent_error_handler);
    cubeb_alsa_error_handler_set = 1;
  }
  pthread_mutex_unlock(&cubeb_alsa_mutex);

  ctx = calloc(1, sizeof(*ctx));
  assert(ctx);

  ctx->ops = &alsa_ops;
  ctx->libasound = libasound;

  r = pthread_mutex_init(&ctx->mutex, NULL);
  assert(r == 0);

  r = pipe(fd);
  assert(r == 0);

  for (i = 0; i < 2; ++i) {
    fcntl(fd[i], F_SETFD, fcntl(fd[i], F_GETFD) | FD_CLOEXEC);
    fcntl(fd[i], F_SETFL, fcntl(fd[i], F_GETFL) | O_NONBLOCK);
  }

  ctx->control_fd_read = fd[0];
  ctx->control_fd_write = fd[1];

  /* Force an early rebuild when alsa_run is first called to ensure fds and
     nfds have been initialized. */
  ctx->rebuild = 1;

  r = pthread_attr_init(&attr);
  assert(r == 0);

  r = pthread_attr_setstacksize(&attr, 256 * 1024);
  assert(r == 0);

  r = pthread_create(&ctx->thread, &attr, alsa_run_thread, ctx);
  assert(r == 0);

  r = pthread_attr_destroy(&attr);
  assert(r == 0);

  /* Open a dummy PCM to force the configuration space to be evaluated so that
     init_local_config_with_workaround can find and modify the default node. */
  r = alsa_locked_pcm_open(&dummy, CUBEB_ALSA_PCM_NAME, SND_PCM_STREAM_PLAYBACK,
                           NULL);
  if (r >= 0) {
    alsa_locked_pcm_close(dummy);
  }
  ctx->is_pa = 0;
  pthread_mutex_lock(&cubeb_alsa_mutex);
  ctx->local_config = init_local_config_with_workaround(CUBEB_ALSA_PCM_NAME);
  pthread_mutex_unlock(&cubeb_alsa_mutex);
  if (ctx->local_config) {
    ctx->is_pa = 1;
    r = alsa_locked_pcm_open(&dummy, CUBEB_ALSA_PCM_NAME,
                             SND_PCM_STREAM_PLAYBACK, ctx->local_config);
    /* If we got a local_config, we found a PA PCM.  If opening a PCM with that
       config fails with EINVAL, the PA PCM is too old for this workaround. */
    if (r == -EINVAL) {
      pthread_mutex_lock(&cubeb_alsa_mutex);
      WRAP(snd_config_delete)(ctx->local_config);
      pthread_mutex_unlock(&cubeb_alsa_mutex);
      ctx->local_config = NULL;
    } else if (r >= 0) {
      alsa_locked_pcm_close(dummy);
    }
  }

  *context = ctx;

  return CUBEB_OK;
}